

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dauCanon.c
# Opt level: O3

int Abc_TgCannonVerify(Abc_TgMan_t *pMan)

{
  uint nVars;
  uint uCanonPhase;
  ulong *puVar1;
  ulong uVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  uint uVar5;
  byte bVar6;
  long lVar7;
  long lVar8;
  ulong uVar9;
  size_t __n;
  ulong uVar10;
  ulong uVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  int iVar19;
  long lVar20;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  int iVar21;
  undefined1 auVar18 [16];
  int iVar22;
  int iVar24;
  int iVar25;
  undefined1 auVar23 [16];
  int iVar26;
  char acStack_38 [16];
  
  puVar1 = pMan->pTruth;
  nVars = pMan->nVars;
  __n = (size_t)(int)nVars;
  bVar6 = (byte)nVars;
  uVar5 = 1 << (bVar6 - 6 & 0x1f);
  if ((long)__n < 7) {
    uVar5 = 1;
  }
  uCanonPhase = pMan->uPhase;
  if ((long)__n < 6) {
    lVar8 = 1L << (bVar6 & 0x3f);
    uVar2 = *puVar1;
    uVar11 = ~(-1L << ((byte)lVar8 & 0x3f)) & uVar2;
    if (nVars < 6) {
      uVar9 = 0x40;
      if (0x40 < (ulong)(lVar8 * 2)) {
        uVar9 = lVar8 * 2;
      }
      uVar10 = (uVar9 - ((ulong)(nVars != 5) + lVar8 * 2) >> (bVar6 & 0x3f)) + (ulong)(nVars != 5);
      auVar23._8_4_ = (int)lVar8;
      auVar23._0_8_ = lVar8;
      auVar23._12_4_ = (int)((ulong)lVar8 >> 0x20);
      lVar7 = auVar23._8_8_ * 2;
      auVar17._8_4_ = (int)lVar7;
      auVar17._0_8_ = lVar8;
      auVar17._12_4_ = (int)((ulong)lVar7 >> 0x20);
      auVar12._8_8_ = 0;
      auVar12._0_8_ = uVar11;
      auVar14._8_4_ = (int)uVar10;
      auVar14._0_8_ = uVar10;
      auVar14._12_4_ = (int)(uVar10 >> 0x20);
      uVar9 = 0xfffffffffffffffe;
      do {
        auVar23 = auVar12;
        lVar20 = auVar17._8_8_;
        auVar3._8_4_ = (int)uVar11;
        auVar3._0_8_ = uVar11;
        auVar3._12_4_ = (int)(uVar11 >> 0x20);
        auVar13._8_8_ = auVar3._8_8_ << lVar20;
        auVar13._0_8_ = uVar11 << auVar17._0_8_;
        auVar12 = auVar13 | auVar23;
        auVar17._0_8_ = auVar17._0_8_ + lVar8 * 2;
        auVar17._8_8_ = lVar20 + lVar7;
        uVar9 = uVar9 + 2;
      } while ((uVar10 & 0xfffffffffffffffe) != uVar9);
      auVar16._8_4_ = (int)uVar9;
      auVar16._0_8_ = uVar9;
      auVar16._12_4_ = (int)(uVar9 >> 0x20);
      auVar14 = auVar14 ^ _DAT_0094e250;
      auVar17 = (auVar16 | _DAT_0094e240) ^ _DAT_0094e250;
      iVar22 = -(uint)(auVar14._0_4_ < auVar17._0_4_);
      iVar24 = -(uint)(auVar14._4_4_ < auVar17._4_4_);
      iVar25 = -(uint)(auVar14._8_4_ < auVar17._8_4_);
      iVar26 = -(uint)(auVar14._12_4_ < auVar17._12_4_);
      iVar19 = -(uint)(auVar17._4_4_ == auVar14._4_4_);
      iVar21 = -(uint)(auVar17._12_4_ == auVar14._12_4_);
      auVar15._4_4_ = iVar19;
      auVar15._0_4_ = iVar19;
      auVar15._8_4_ = iVar21;
      auVar15._12_4_ = iVar21;
      auVar4._4_4_ = iVar22;
      auVar4._0_4_ = iVar22;
      auVar4._8_4_ = iVar25;
      auVar4._12_4_ = iVar25;
      auVar18._4_4_ = iVar24;
      auVar18._0_4_ = iVar24;
      auVar18._8_4_ = iVar26;
      auVar18._12_4_ = iVar26;
      auVar18 = auVar18 | auVar15 & auVar4;
      auVar12 = ~auVar18 & auVar12 | auVar23 & auVar18;
      uVar11 = auVar12._8_8_ | auVar12._0_8_;
    }
    if (uVar2 != uVar11) {
      __assert_fail("*pTruth == nTruth",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/dau/dauCanon.c"
                    ,0x137,"void Abc_TtVerifySmallTruth(word *, int)");
    }
  }
  if ((int)uVar5 < 1) {
    memcpy(acStack_38,pMan->pPermT,__n);
    Abc_TtImplementNpnConfig(&Abc_TtCannonVerify_pCopy2,nVars,acStack_38,uCanonPhase);
  }
  else {
    lVar8 = 0;
    do {
      *(undefined8 *)((long)&Abc_TtCannonVerify_pCopy2 + lVar8) =
           *(undefined8 *)((long)puVar1 + lVar8);
      lVar8 = lVar8 + 8;
    } while ((ulong)uVar5 << 3 != lVar8);
    memcpy(acStack_38,pMan->pPermT,__n);
    Abc_TtImplementNpnConfig(&Abc_TtCannonVerify_pCopy2,nVars,acStack_38,uCanonPhase);
    lVar8 = 0;
    do {
      if (*(long *)((long)gpVerCopy + lVar8) != *(long *)((long)&Abc_TtCannonVerify_pCopy2 + lVar8))
      {
        return 0;
      }
      lVar8 = lVar8 + 8;
    } while ((ulong)uVar5 << 3 != lVar8);
  }
  return 1;
}

Assistant:

static inline int Abc_TgCannonVerify(Abc_TgMan_t* pMan)
{
    return Abc_TtCannonVerify(pMan->pTruth, pMan->nVars, pMan->pPermT, pMan->uPhase);
}